

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

string * draco::LowercaseMimeTypeExtension(string *mime_type)

{
  long lVar1;
  long lVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t pos;
  string local_50 [16];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  allocator<char> local_19;
  long local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  local_18 = lVar1;
  if (((lVar1 != 0) && (lVar1 != -1)) &&
     (lVar2 = std::__cxx11::string::length(), lVar1 != lVar2 + -1)) {
    std::__cxx11::string::substr((ulong)local_50,local_10);
    parser::ToLower(in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string(local_50);
    return in_RDI;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(&local_19);
  return in_RDI;
}

Assistant:

std::string LowercaseMimeTypeExtension(const std::string &mime_type) {
  const size_t pos = mime_type.find_last_of('/');
  if (pos == 0 || pos == std::string::npos || pos == mime_type.length() - 1) {
    return "";
  }
  return parser::ToLower(mime_type.substr(pos + 1));
}